

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O3

void __thiscall deci::stack_t::Print(stack_t *this,ostream *output)

{
  pointer ppvVar1;
  pointer ppvVar2;
  ostream *poVar3;
  value_t *pvVar4;
  long lVar5;
  long lVar6;
  size_t depth;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  ppvVar1 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppvVar2 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(output,"result: ",8);
  (*this->result->_vptr_value_t[4])(&local_50);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,local_50,local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (ppvVar2 != ppvVar1) {
    lVar6 = (long)ppvVar2 - (long)ppvVar1 >> 3;
    depth = 0;
    do {
      pvVar4 = Top(this,depth);
      lVar5 = *(long *)output;
      *(uint *)(output + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(output + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
      *(uint *)(output + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(output + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar3 = output + *(long *)(lVar5 + -0x18);
      if (output[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar3);
        poVar3[0xe1] = (ostream)0x1;
        lVar5 = *(long *)output;
      }
      poVar3[0xe0] = (ostream)0x30;
      *(undefined8 *)(output + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)output);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      (*pvVar4->_vptr_value_t[4])(&local_50,pvVar4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      depth = depth + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != depth);
  }
  return;
}

Assistant:

void stack_t::Print(std::ostream& output) {
    size_t depth = this->Depth();

    output << "result: " << this->result->ToText() << std::endl;

    for (size_t i = 0; i < depth; ++i) {
      value_t& elem = this->Top(i);
      output << std::right << std::hex << std::setfill('0')
        << std::setw(4) << i << ": "
        << elem.ToText() << std::endl;
    }
  }